

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

vector<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_> *
__thiscall minibag::View::getConnections(View *this)

{
  bool bVar1;
  vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_> *in_RSI;
  vector<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_> *in_RDI;
  MessageRange *range;
  iterator __end1;
  iterator __begin1;
  vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_> *__range1;
  vector<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>
  *connections;
  vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>
  *in_stack_ffffffffffffff98;
  vector<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_> *this_00
  ;
  __normal_iterator<minibag::MessageRange_**,_std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>_>
  in_stack_ffffffffffffffc8;
  vector<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>
  *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  std::vector<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>::
  vector((vector<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>
          *)0x17bb2f);
  std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>::size(in_RSI);
  std::vector<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>::
  reserve(in_stack_ffffffffffffffd0,(size_type)in_stack_ffffffffffffffc8._M_current);
  std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>::begin
            (in_stack_ffffffffffffff98);
  std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>::end
            (in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<minibag::MessageRange_**,_std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<minibag::MessageRange_**,_std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>_>
                             *)in_stack_ffffffffffffff98), bVar1) {
    __gnu_cxx::
    __normal_iterator<minibag::MessageRange_**,_std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>_>
    ::operator*((__normal_iterator<minibag::MessageRange_**,_std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>_>
                 *)&stack0xffffffffffffffc8);
    std::vector<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>::
    push_back(this_00,(value_type *)in_RSI);
    __gnu_cxx::
    __normal_iterator<minibag::MessageRange_**,_std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>_>
    ::operator++((__normal_iterator<minibag::MessageRange_**,_std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>_>
                  *)&stack0xffffffffffffffc8);
  }
  return in_RDI;
}

Assistant:

std::vector<const ConnectionInfo*> View::getConnections()
{
  std::vector<const ConnectionInfo*> connections;
  connections.reserve(ranges_.size());

  for (MessageRange* range : ranges_)
  {
    connections.push_back(range->connection_info);
  }

  return connections;
}